

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O3

int secp256k1_xonly_pubkey_parse
              (secp256k1_context *ctx,secp256k1_xonly_pubkey *pubkey,uchar *input32)

{
  int iVar1;
  secp256k1_fe x;
  secp256k1_ge pk;
  secp256k1_ge_storage s;
  secp256k1_fe local_f0;
  secp256k1_ge local_c0;
  secp256k1_ge_storage local_58;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_xonly_pubkey_parse_cold_3();
  }
  else if (pubkey != (secp256k1_xonly_pubkey *)0x0) {
    pubkey->data[0x30] = '\0';
    pubkey->data[0x31] = '\0';
    pubkey->data[0x32] = '\0';
    pubkey->data[0x33] = '\0';
    pubkey->data[0x34] = '\0';
    pubkey->data[0x35] = '\0';
    pubkey->data[0x36] = '\0';
    pubkey->data[0x37] = '\0';
    pubkey->data[0x38] = '\0';
    pubkey->data[0x39] = '\0';
    pubkey->data[0x3a] = '\0';
    pubkey->data[0x3b] = '\0';
    pubkey->data[0x3c] = '\0';
    pubkey->data[0x3d] = '\0';
    pubkey->data[0x3e] = '\0';
    pubkey->data[0x3f] = '\0';
    pubkey->data[0x20] = '\0';
    pubkey->data[0x21] = '\0';
    pubkey->data[0x22] = '\0';
    pubkey->data[0x23] = '\0';
    pubkey->data[0x24] = '\0';
    pubkey->data[0x25] = '\0';
    pubkey->data[0x26] = '\0';
    pubkey->data[0x27] = '\0';
    pubkey->data[0x28] = '\0';
    pubkey->data[0x29] = '\0';
    pubkey->data[0x2a] = '\0';
    pubkey->data[0x2b] = '\0';
    pubkey->data[0x2c] = '\0';
    pubkey->data[0x2d] = '\0';
    pubkey->data[0x2e] = '\0';
    pubkey->data[0x2f] = '\0';
    pubkey->data[0x10] = '\0';
    pubkey->data[0x11] = '\0';
    pubkey->data[0x12] = '\0';
    pubkey->data[0x13] = '\0';
    pubkey->data[0x14] = '\0';
    pubkey->data[0x15] = '\0';
    pubkey->data[0x16] = '\0';
    pubkey->data[0x17] = '\0';
    pubkey->data[0x18] = '\0';
    pubkey->data[0x19] = '\0';
    pubkey->data[0x1a] = '\0';
    pubkey->data[0x1b] = '\0';
    pubkey->data[0x1c] = '\0';
    pubkey->data[0x1d] = '\0';
    pubkey->data[0x1e] = '\0';
    pubkey->data[0x1f] = '\0';
    pubkey->data[0] = '\0';
    pubkey->data[1] = '\0';
    pubkey->data[2] = '\0';
    pubkey->data[3] = '\0';
    pubkey->data[4] = '\0';
    pubkey->data[5] = '\0';
    pubkey->data[6] = '\0';
    pubkey->data[7] = '\0';
    pubkey->data[8] = '\0';
    pubkey->data[9] = '\0';
    pubkey->data[10] = '\0';
    pubkey->data[0xb] = '\0';
    pubkey->data[0xc] = '\0';
    pubkey->data[0xd] = '\0';
    pubkey->data[0xe] = '\0';
    pubkey->data[0xf] = '\0';
    if (input32 == (uchar *)0x0) {
      secp256k1_xonly_pubkey_parse_cold_1();
      return 0;
    }
    secp256k1_fe_impl_set_b32_mod(&local_f0,input32);
    if (((0xffffefffffc2e < local_f0.n[0]) && (local_f0.n[4] == 0xffffffffffff)) &&
       ((local_f0.n[2] & local_f0.n[3] & local_f0.n[1]) == 0xfffffffffffff)) {
      return 0;
    }
    local_f0.magnitude = 1;
    local_f0.normalized = 1;
    secp256k1_fe_verify(&local_f0);
    iVar1 = secp256k1_ge_set_xo_var(&local_c0,&local_f0,0);
    if (iVar1 != 0) {
      secp256k1_ge_to_storage(&local_58,&local_c0);
      *(uint64_t *)(pubkey->data + 0x30) = local_58.y.n[2];
      *(uint64_t *)(pubkey->data + 0x38) = local_58.y.n[3];
      *(uint64_t *)(pubkey->data + 0x20) = local_58.y.n[0];
      *(uint64_t *)(pubkey->data + 0x28) = local_58.y.n[1];
      *(uint64_t *)(pubkey->data + 0x10) = local_58.x.n[2];
      *(uint64_t *)(pubkey->data + 0x18) = local_58.x.n[3];
      *(uint64_t *)pubkey->data = local_58.x.n[0];
      *(uint64_t *)(pubkey->data + 8) = local_58.x.n[1];
      return 1;
    }
    return 0;
  }
  secp256k1_xonly_pubkey_parse_cold_2();
  return 0;
}

Assistant:

int secp256k1_xonly_pubkey_parse(const secp256k1_context* ctx, secp256k1_xonly_pubkey *pubkey, const unsigned char *input32) {
    secp256k1_ge pk;
    secp256k1_fe x;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(input32 != NULL);

    if (!secp256k1_fe_set_b32_limit(&x, input32)) {
        return 0;
    }
    if (!secp256k1_ge_set_xo_var(&pk, &x, 0)) {
        return 0;
    }
    if (!secp256k1_ge_is_in_correct_subgroup(&pk)) {
        return 0;
    }
    secp256k1_xonly_pubkey_save(pubkey, &pk);
    return 1;
}